

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O3

Abc_Cex_t * Fra_SmlCopyCounterExample(Aig_Man_t *pAig,Aig_Man_t *pFrames,int *pModel)

{
  int iVar1;
  ulong uVar2;
  Abc_Cex_t *p;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int nRealPis;
  int iVar6;
  
  iVar4 = pAig->nRegs;
  if (iVar4 < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x463,"Abc_Cex_t *Fra_SmlCopyCounterExample(Aig_Man_t *, Aig_Man_t *, int *)");
  }
  if (pFrames->nRegs != 0) {
    __assert_fail("Aig_ManRegNum(pFrames) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x464,"Abc_Cex_t *Fra_SmlCopyCounterExample(Aig_Man_t *, Aig_Man_t *, int *)");
  }
  nRealPis = pAig->nObjs[2] - iVar4;
  iVar1 = pFrames->nObjs[2];
  if ((iVar1 / nRealPis) * nRealPis != iVar1) {
    __assert_fail("nTruePis * nFrames == Aig_ManCiNum(pFrames)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x468,"Abc_Cex_t *Fra_SmlCopyCounterExample(Aig_Man_t *, Aig_Man_t *, int *)");
  }
  iVar6 = pAig->nObjs[3] - iVar4;
  if ((iVar1 / nRealPis) * iVar6 == pFrames->nObjs[3]) {
    uVar5 = (ulong)pFrames->vCos->nSize;
    if (0 < (long)uVar5) {
      uVar2 = 0;
      do {
        if (*(int *)((long)pFrames->vCos->pArray[uVar2] + 0x24) == pModel[iVar1]) {
          uVar5 = (ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff;
          iVar1 = (int)((long)uVar5 / (long)iVar6);
          p = Abc_CexAlloc(iVar4,nRealPis,iVar1 + 1);
          p->iPo = (int)((long)uVar5 % (long)iVar6);
          p->iFrame = iVar1;
          if (0 < pFrames->nObjs[2]) {
            iVar4 = p->nRegs;
            lVar3 = 0;
            do {
              if (pModel[lVar3] != 0) {
                iVar4 = iVar4 + (int)lVar3;
                (&p[1].iPo)[iVar4 >> 5] = (&p[1].iPo)[iVar4 >> 5] | 1 << ((byte)iVar4 & 0x1f);
                iVar4 = p->nRegs;
              }
            } while (((int)lVar3 + iVar4 != p->nBits + -1) &&
                    (lVar3 = lVar3 + 1, lVar3 < pFrames->nObjs[2]));
          }
          iVar4 = Saig_ManVerifyCex(pAig,p);
          if (iVar4 == 0) {
            puts("Fra_SmlGetCounterExample(): Counter-example is invalid.");
            Abc_CexFree(p);
            p = (Abc_Cex_t *)0x0;
          }
          return p;
        }
        uVar2 = uVar2 + 1;
      } while (uVar5 != uVar2);
    }
    __assert_fail("iPo >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x474,"Abc_Cex_t *Fra_SmlCopyCounterExample(Aig_Man_t *, Aig_Man_t *, int *)");
  }
  __assert_fail("nTruePos * nFrames == Aig_ManCoNum(pFrames)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                ,0x469,"Abc_Cex_t *Fra_SmlCopyCounterExample(Aig_Man_t *, Aig_Man_t *, int *)");
}

Assistant:

Abc_Cex_t * Fra_SmlCopyCounterExample( Aig_Man_t * pAig, Aig_Man_t * pFrames, int * pModel )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    int i, nFrames, nTruePis, nTruePos, iPo, iFrame;
    // get the number of frames
    assert( Aig_ManRegNum(pAig) > 0 );
    assert( Aig_ManRegNum(pFrames) == 0 );
    nTruePis = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
    nTruePos = Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig);
    nFrames = Aig_ManCiNum(pFrames) / nTruePis;
    assert( nTruePis * nFrames == Aig_ManCiNum(pFrames) );
    assert( nTruePos * nFrames == Aig_ManCoNum(pFrames) );
    // find the PO that failed
    iPo = -1;
    iFrame = -1;
    Aig_ManForEachCo( pFrames, pObj, i )
        if ( pObj->Id == pModel[Aig_ManCiNum(pFrames)] )
        {
            iPo = i % nTruePos;
            iFrame = i / nTruePos;
            break;
        }
    assert( iPo >= 0 );
    // allocate the counter example
    pCex = Abc_CexAlloc( Aig_ManRegNum(pAig), nTruePis, iFrame + 1 );
    pCex->iPo    = iPo;
    pCex->iFrame = iFrame;

    // copy the bit data
    for ( i = 0; i < Aig_ManCiNum(pFrames); i++ )
    {
        if ( pModel[i] )
            Abc_InfoSetBit( pCex->pData, pCex->nRegs + i );
        if ( pCex->nRegs + i == pCex->nBits - 1 )
            break;
    }

    // verify the counter example
    if ( !Saig_ManVerifyCex( pAig, pCex ) )
    {
        printf( "Fra_SmlGetCounterExample(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    return pCex;

}